

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O0

void __thiscall leveldb::Benchmark::Read(Benchmark *this,Order order,int entries_per_batch)

{
  sqlite3 *psVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  uint local_144;
  char local_118 [4];
  int k;
  char key [100];
  int j;
  int i;
  bool transaction;
  string end_trans_str;
  allocator local_81;
  string local_80 [8];
  string begin_trans_str;
  allocator local_59;
  string local_58 [8];
  string read_str;
  undefined8 local_38;
  sqlite3_stmt *end_trans_stmt;
  sqlite3_stmt *begin_trans_stmt;
  sqlite3_stmt *read_stmt;
  int local_18;
  int status;
  int entries_per_batch_local;
  Order order_local;
  Benchmark *this_local;
  
  local_18 = entries_per_batch;
  status = order;
  _entries_per_batch_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"SELECT * FROM test WHERE key = ?",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"BEGIN TRANSACTION;",&local_81);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"END TRANSACTION;",(allocator *)((long)&j + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&j + 3));
  psVar1 = this->db_;
  uVar3 = std::__cxx11::string::c_str();
  read_stmt._4_4_ = sqlite3_prepare_v2(psVar1,uVar3,0xffffffff,&end_trans_stmt,0);
  ErrorCheck(read_stmt._4_4_);
  psVar1 = this->db_;
  uVar3 = std::__cxx11::string::c_str();
  read_stmt._4_4_ = sqlite3_prepare_v2(psVar1,uVar3,0xffffffff,&local_38,0);
  ErrorCheck(read_stmt._4_4_);
  psVar1 = this->db_;
  uVar3 = std::__cxx11::string::c_str();
  read_stmt._4_4_ = sqlite3_prepare_v2(psVar1,uVar3,0xffffffff,&begin_trans_stmt,0);
  ErrorCheck(read_stmt._4_4_);
  j._2_1_ = 1 < local_18;
  key[0x60] = '\0';
  key[0x61] = '\0';
  key[0x62] = '\0';
  key[99] = '\0';
  for (; (int)key._96_4_ < this->reads_; key._96_4_ = local_18 + key._96_4_) {
    if (((FLAGS_transaction & 1U) != 0) && ((j._2_1_ & 1) != 0)) {
      read_stmt._4_4_ = sqlite3_step(end_trans_stmt);
      StepErrorCheck(read_stmt._4_4_);
      read_stmt._4_4_ = sqlite3_reset(end_trans_stmt);
      ErrorCheck(read_stmt._4_4_);
    }
    key[0x5c] = '\0';
    key[0x5d] = '\0';
    key[0x5e] = '\0';
    key[0x5f] = '\0';
    for (; (int)key._92_4_ < local_18; key._92_4_ = key._92_4_ + 1) {
      if (status == 0) {
        local_144 = key._96_4_ + key._92_4_;
      }
      else {
        uVar2 = Random::Next(&this->rand_);
        local_144 = uVar2 % (uint)this->reads_;
      }
      snprintf(local_118,100,"%016d",(ulong)local_144);
      read_stmt._4_4_ = sqlite3_bind_blob(begin_trans_stmt,1,local_118,0x10,0);
      ErrorCheck(read_stmt._4_4_);
      while( true ) {
        read_stmt._4_4_ = sqlite3_step(begin_trans_stmt);
        if (read_stmt._4_4_ != 100) break;
        read_stmt._4_4_ = 100;
      }
      StepErrorCheck(read_stmt._4_4_);
      read_stmt._4_4_ = sqlite3_clear_bindings(begin_trans_stmt);
      ErrorCheck(read_stmt._4_4_);
      read_stmt._4_4_ = sqlite3_reset(begin_trans_stmt);
      ErrorCheck(read_stmt._4_4_);
      FinishedSingleOp(this);
    }
    if (((FLAGS_transaction & 1U) != 0) && ((j._2_1_ & 1) != 0)) {
      read_stmt._4_4_ = sqlite3_step(local_38);
      StepErrorCheck(read_stmt._4_4_);
      read_stmt._4_4_ = sqlite3_reset(local_38);
      ErrorCheck(read_stmt._4_4_);
    }
  }
  read_stmt._4_4_ = sqlite3_finalize(begin_trans_stmt);
  ErrorCheck(read_stmt._4_4_);
  read_stmt._4_4_ = sqlite3_finalize(end_trans_stmt);
  ErrorCheck(read_stmt._4_4_);
  read_stmt._4_4_ = sqlite3_finalize(local_38);
  ErrorCheck(read_stmt._4_4_);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void Read(Order order, int entries_per_batch) {
    int status;
    sqlite3_stmt *read_stmt, *begin_trans_stmt, *end_trans_stmt;

    std::string read_str = "SELECT * FROM test WHERE key = ?";
    std::string begin_trans_str = "BEGIN TRANSACTION;";
    std::string end_trans_str = "END TRANSACTION;";

    // Preparing sqlite3 statements
    status = sqlite3_prepare_v2(db_, begin_trans_str.c_str(), -1,
                                &begin_trans_stmt, nullptr);
    ErrorCheck(status);
    status = sqlite3_prepare_v2(db_, end_trans_str.c_str(), -1, &end_trans_stmt,
                                nullptr);
    ErrorCheck(status);
    status = sqlite3_prepare_v2(db_, read_str.c_str(), -1, &read_stmt, nullptr);
    ErrorCheck(status);

    bool transaction = (entries_per_batch > 1);
    for (int i = 0; i < reads_; i += entries_per_batch) {
      // Begin read transaction
      if (FLAGS_transaction && transaction) {
        status = sqlite3_step(begin_trans_stmt);
        StepErrorCheck(status);
        status = sqlite3_reset(begin_trans_stmt);
        ErrorCheck(status);
      }

      // Create and execute SQL statements
      for (int j = 0; j < entries_per_batch; j++) {
        // Create key value
        char key[100];
        int k = (order == SEQUENTIAL) ? i + j : (rand_.Next() % reads_);
        std::snprintf(key, sizeof(key), "%016d", k);

        // Bind key value into read_stmt
        status = sqlite3_bind_blob(read_stmt, 1, key, 16, SQLITE_STATIC);
        ErrorCheck(status);

        // Execute read statement
        while ((status = sqlite3_step(read_stmt)) == SQLITE_ROW) {
        }
        StepErrorCheck(status);

        // Reset SQLite statement for another use
        status = sqlite3_clear_bindings(read_stmt);
        ErrorCheck(status);
        status = sqlite3_reset(read_stmt);
        ErrorCheck(status);
        FinishedSingleOp();
      }

      // End read transaction
      if (FLAGS_transaction && transaction) {
        status = sqlite3_step(end_trans_stmt);
        StepErrorCheck(status);
        status = sqlite3_reset(end_trans_stmt);
        ErrorCheck(status);
      }
    }

    status = sqlite3_finalize(read_stmt);
    ErrorCheck(status);
    status = sqlite3_finalize(begin_trans_stmt);
    ErrorCheck(status);
    status = sqlite3_finalize(end_trans_stmt);
    ErrorCheck(status);
  }